

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O0

void __thiscall myvk::RenderPass::~RenderPass(RenderPass *this)

{
  void *in_RDI;
  RenderPass *unaff_retaddr;
  
  ~RenderPass(unaff_retaddr);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

RenderPass::~RenderPass() {
	if (m_render_pass)
		vkDestroyRenderPass(m_device_ptr->GetHandle(), m_render_pass, nullptr);
}